

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::tracker_connection::fail_impl
          (tracker_connection *this,error_code *ec,operation_t op,string *msg,seconds32 interval,
          seconds32 min_interval)

{
  int iVar1;
  element_type *peVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar4;
  bool bVar5;
  
  this_00 = (this->m_requester).
            super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = this_00->_M_use_count;
    do {
      if (iVar3 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar5 = iVar3 == iVar1;
      if (bVar5) {
        this_00->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar5);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar5 = true;
  }
  else {
    bVar5 = this_00->_M_use_count == 0;
  }
  peVar2 = (this->m_requester).
           super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (!(bool)(peVar2 == (element_type *)0x0 | bVar5)) {
    uVar4 = (ulong)(uint)min_interval.__r;
    if (interval.__r != 0) {
      uVar4 = (ulong)(uint)interval.__r;
    }
    (*peVar2->_vptr_request_callback[5])(peVar2,&this->m_req,ec,op,msg,uVar4);
  }
  (*(this->super_timeout_handler)._vptr_timeout_handler[4])(this);
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return;
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void tracker_connection::fail_impl(error_code const& ec, operation_t const op
		, std::string const msg, seconds32 const interval, seconds32 const min_interval)
	{
		std::shared_ptr<request_callback> cb = requester();
		if (cb) cb->tracker_request_error(m_req, ec, op, msg
			, interval.count() == 0 ? min_interval : interval);
		close();
	}